

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

string * __thiscall helics::InputInfo::getSourceName_abi_cxx11_(InputInfo *this,GlobalHandle source)

{
  bool bVar1;
  int iVar2;
  GlobalHandle GVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  long in_RDI;
  size_t ii;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  GlobalHandle GVar6;
  GlobalHandle id;
  string *local_8;
  
  if ((getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_)
     , iVar2 != 0)) {
    std::__cxx11::string::string(in_stack_ffffffffffffffe0);
    __cxa_atexit(std::__cxx11::string::~string,
                 &getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_);
  }
  GVar6.fed_id.gid = 0;
  GVar6.handle.hid = 0;
  do {
    id = GVar6;
    GVar3 = (GlobalHandle)
            std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                      ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                       (in_RDI + 0xb0));
    if ((ulong)GVar3 <= (ulong)GVar6) {
      local_8 = &getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_;
      return local_8;
    }
    pvVar4 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::operator[]
                       ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                        (in_RDI + 0xb0),(size_type)id);
    bVar1 = GlobalHandle::operator==((GlobalHandle *)*pvVar4,id);
    GVar6 = id;
  } while (!bVar1);
  pvVar5 = std::
           vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
           ::operator[]((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                         *)(in_RDI + 0xe0),(size_type)id);
  return &pvVar5->key;
}

Assistant:

const std::string& InputInfo::getSourceName(GlobalHandle source) const
{
    static const std::string empty{};
    size_t ii{0};
    while (ii < input_sources.size()) {
        if (source == input_sources[ii]) {
            return source_info[ii].key;
        }
    }
    return empty;
}